

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<double>::copy<double>(HVectorBase<double> *this,HVectorBase<double> *from)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RSI;
  long in_RDI;
  double xFrom;
  HighsInt iFrom;
  HighsInt i;
  double *fromArray;
  HighsInt *fromIndex;
  HighsInt fromCount;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar9;
  
  clear((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  iVar2 = *(int *)(in_RSI + 4);
  *(int *)(in_RDI + 4) = iVar2;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),0);
  for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
    iVar3 = pvVar4[iVar9];
    vVar1 = pvVar5[iVar3];
    iVar8 = iVar3;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar9);
    *pvVar6 = iVar3;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar8);
    *pvVar7 = vVar1;
  }
  return;
}

Assistant:

void HVectorBase<Real>::copy(const HVectorBase<FromReal>* from) {
  /*
   * Copy from another HVector structure to this instance
   * The real type of "from" does not need to be the same, but must be
   * convertible to this HVector's real type.
   */
  clear();
  synthetic_tick = from->synthetic_tick;
  const HighsInt fromCount = count = from->count;
  const HighsInt* fromIndex = &from->index[0];
  const FromReal* fromArray = &from->array[0];
  for (HighsInt i = 0; i < fromCount; i++) {
    const HighsInt iFrom = fromIndex[i];
    const FromReal xFrom = fromArray[iFrom];
    index[i] = iFrom;
    array[iFrom] = Real(xFrom);
  }
}